

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  byte bVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  char cVar3;
  DTD *pDVar4;
  ATTRIBUTE *pAVar5;
  DEFAULT_ATTRIBUTE *pDVar6;
  XML_Char *pXVar7;
  undefined8 *puVar8;
  byte bVar9;
  byte bVar10;
  XML_Bool XVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  XML_Error XVar15;
  int iVar16;
  uint uVar17;
  ELEMENT_TYPE *elementType;
  ATTRIBUTE *pAVar18;
  ATTRIBUTE_ID *pAVar19;
  XML_Char *pXVar20;
  long lVar21;
  NS_ATT *pNVar22;
  NAMED *pNVar23;
  size_t len;
  uint64_t uVar24;
  char *pcVar25;
  TAG *pTVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  unsigned_long uVar30;
  ulong uVar31;
  byte bVar32;
  KEY name;
  BINDING *pBVar33;
  char *pcVar34;
  long lVar35;
  bool bVar36;
  sipkey sip_key;
  siphash local_68;
  
  pDVar4 = parser->m_dtd;
  elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,tagNamePtr->str,0);
  if (elementType == (ELEMENT_TYPE *)0x0) {
    pXVar20 = poolCopyString(&pDVar4->pool,tagNamePtr->str);
    if (pXVar20 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,pXVar20,0x28);
    if (elementType == (ELEMENT_TYPE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if ((parser->m_ns != '\0') && (iVar16 = setElementTypePrefix(parser,elementType), iVar16 == 0))
    {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar17 = elementType->nDefaultAtts;
  uVar12 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  iVar13 = uVar12 + uVar17;
  iVar16 = parser->m_attsSize;
  pAVar18 = parser->m_atts;
  if (iVar16 < iVar13) {
    parser->m_attsSize = iVar13 + 0x10;
    pAVar18 = (ATTRIBUTE *)(*(parser->m_mem).realloc_fcn)(pAVar18,(long)iVar13 * 0x20 + 0x200);
    if (pAVar18 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar16;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = pAVar18;
    if (iVar16 < (int)uVar12) {
      (*enc->getAtts)(enc,attStr,uVar12,pAVar18);
      pAVar18 = parser->m_atts;
    }
  }
  uVar31 = 0;
  uVar27 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar27 = uVar31;
  }
  pool = &parser->m_tempPool;
  uVar28 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar28 = uVar31;
  }
  iVar16 = 0;
  iVar13 = 0;
  for (; uVar31 != uVar28; uVar31 = uVar31 + 1) {
    pcVar34 = parser->m_atts[uVar31].name;
    iVar14 = (*enc->nameLength)(enc,pcVar34);
    pAVar19 = getAttributeId(parser,enc,pcVar34,pcVar34 + iVar14);
    if (pAVar19 == (ATTRIBUTE_ID *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (pAVar19->name[-1] != '\0') {
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = parser->m_atts[uVar31].name;
        return XML_ERROR_DUPLICATE_ATTRIBUTE;
      }
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    pAVar19->name[-1] = '\x01';
    iVar14 = iVar13 + 1;
    (&pAVar18->name)[iVar13] = pAVar19->name;
    pAVar5 = parser->m_atts;
    if (pAVar5[uVar31].normalized == '\0') {
      XVar11 = '\x01';
      if (pAVar19->maybeTokenized != '\0') {
        lVar21 = 0;
        do {
          lVar35 = lVar21;
          if (uVar27 * 0x18 + 0x18 == lVar35 + 0x18) goto LAB_0032d971;
          lVar21 = lVar35 + 0x18;
        } while (pAVar19 != *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar35));
        XVar11 = (&elementType->defaultAtts->isCdata)[lVar35];
      }
LAB_0032d971:
      XVar15 = storeAttributeValue(parser,enc,XVar11,pAVar5[uVar31].valuePtr,pAVar5[uVar31].valueEnd
                                   ,pool);
      if (XVar15 != XML_ERROR_NONE) {
        return XVar15;
      }
      (&pAVar18->name)[iVar14] = (parser->m_tempPool).start;
    }
    else {
      pXVar20 = poolStoreString(pool,enc,pAVar5[uVar31].valuePtr,pAVar5[uVar31].valueEnd);
      (&pAVar18->name)[iVar14] = pXVar20;
      if (pXVar20 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    (parser->m_tempPool).start = (parser->m_tempPool).ptr;
    if (pAVar19->prefix == (PREFIX *)0x0) {
      iVar13 = iVar13 + 2;
    }
    else if (pAVar19->xmlns == '\0') {
      iVar13 = iVar13 + 2;
      iVar16 = iVar16 + 1;
      pAVar19->name[-1] = '\x02';
    }
    else {
      XVar15 = addBinding(parser,pAVar19->prefix,pAVar19,(&pAVar18->name)[iVar14],bindingsPtr);
      if (XVar15 != XML_ERROR_NONE) {
        return XVar15;
      }
    }
  }
  parser->m_nSpecifiedAtts = iVar13;
  lVar21 = -1;
  if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
     (pcVar34 = elementType->idAtt->name, pcVar34[-1] == '\0')) {
LAB_0032da97:
    parser->m_idAttIndex = (int)lVar21;
  }
  else {
    for (lVar21 = 0; lVar21 < iVar13; lVar21 = lVar21 + 2) {
      if ((&pAVar18->name)[lVar21] == pcVar34) goto LAB_0032da97;
    }
  }
  for (lVar21 = 0; lVar35 = (long)iVar13, uVar27 * 0x18 - lVar21 != 0; lVar21 = lVar21 + 0x18) {
    pDVar6 = elementType->defaultAtts;
    pAVar19 = *(ATTRIBUTE_ID **)((long)&pDVar6->id + lVar21);
    pXVar20 = pAVar19->name;
    if ((pXVar20[-1] == '\0') &&
       (pXVar7 = *(XML_Char **)((long)&pDVar6->value + lVar21), pXVar7 != (XML_Char *)0x0)) {
      if (pAVar19->prefix == (PREFIX *)0x0) {
        pXVar20[-1] = '\x01';
      }
      else {
        if (pAVar19->xmlns != '\0') {
          XVar15 = addBinding(parser,pAVar19->prefix,pAVar19,pXVar7,bindingsPtr);
          if (XVar15 != XML_ERROR_NONE) {
            return XVar15;
          }
          goto LAB_0032dad1;
        }
        pXVar20[-1] = '\x02';
        iVar16 = iVar16 + 1;
      }
      (&pAVar18->name)[lVar35] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar21);
      iVar13 = iVar13 + 2;
      (&pAVar18->valuePtr)[lVar35] = *(char **)((long)&pDVar6->value + lVar21);
    }
LAB_0032dad1:
  }
  (&pAVar18->name)[lVar35] = (char *)0x0;
  if (iVar16 == 0) {
    lVar21 = 0;
    goto LAB_0032dbd9;
  }
  bVar32 = parser->m_nsAttsPower;
  bVar10 = bVar32;
  if (iVar16 * 2 >> (bVar32 & 0x1f) == 0) {
    iVar13 = 1 << (bVar32 & 0x1f);
    uVar30 = parser->m_nsAttsVersion;
    if (uVar30 == 0) goto LAB_0032df94;
  }
  else {
    do {
      bVar1 = bVar10 + 1;
      bVar9 = bVar10 & 0x1f;
      bVar10 = bVar1;
    } while (iVar16 >> bVar9 != 0);
    bVar10 = 3;
    if (3 < bVar1) {
      bVar10 = bVar1;
    }
    iVar13 = 1 << (bVar10 & 0x1f);
    parser->m_nsAttsPower = bVar10;
    pNVar22 = (NS_ATT *)(*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,(long)iVar13 * 0x18);
    if (pNVar22 == (NS_ATT *)0x0) {
      parser->m_nsAttsPower = bVar32;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_nsAtts = pNVar22;
LAB_0032df94:
    uVar30 = 0xffffffff;
    lVar21 = (long)iVar13;
    pNVar22 = parser->m_nsAtts + lVar21;
    while( true ) {
      pNVar22 = pNVar22 + -1;
      bVar36 = lVar21 == 0;
      lVar21 = lVar21 + -1;
      if (bVar36) break;
      pNVar22->version = 0xffffffff;
    }
  }
  uVar30 = uVar30 - 1;
  parser->m_nsAttsVersion = uVar30;
  uVar17 = iVar13 - 1;
  for (lVar21 = 0; lVar21 < lVar35; lVar21 = lVar21 + 2) {
    name = (&pAVar18->name)[lVar21];
    if (name[-1] == '\x02') {
      copy_salt_to_sipkey(parser,&sip_key);
      local_68.v0._0_4_ = (uint)sip_key.k[0] ^ 0x70736575;
      local_68.v0._4_4_ = sip_key.k[0]._4_4_ ^ 0x736f6d65;
      local_68.v1._0_4_ = (uint)sip_key.k[1] ^ 0x6e646f6d;
      local_68.v1._4_4_ = sip_key.k[1]._4_4_ ^ 0x646f7261;
      local_68.v2._0_4_ = (uint)sip_key.k[0] ^ 0x6e657261;
      local_68.v2._4_4_ = sip_key.k[0]._4_4_ ^ 0x6c796765;
      local_68.v3._0_4_ = (uint)sip_key.k[1] ^ 0x79746573;
      local_68.v3._4_4_ = sip_key.k[1]._4_4_ ^ 0x74656462;
      local_68.p = local_68.buf;
      local_68.c = 0;
      name[-1] = '\0';
      pNVar23 = lookup(parser,&pDVar4->attributeIds,name,0);
      if (pNVar23 == (NAMED *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if (pNVar23[1].name == (KEY)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      puVar8 = *(undefined8 **)(pNVar23[1].name + 8);
      if (puVar8 == (undefined8 *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      lVar29 = 0;
      while( true ) {
        if (*(int *)(puVar8 + 5) <= lVar29) break;
        XVar2 = *(XML_Char *)((long)puVar8[4] + lVar29);
        pXVar20 = (parser->m_tempPool).ptr;
        if (pXVar20 == (parser->m_tempPool).end) {
          XVar11 = poolGrow(pool);
          if (XVar11 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar20 = (parser->m_tempPool).ptr;
        }
        (parser->m_tempPool).ptr = pXVar20 + 1;
        *pXVar20 = XVar2;
        lVar29 = lVar29 + 1;
      }
      sip24_update(&local_68,(void *)puVar8[4],(long)*(int *)(puVar8 + 5));
      do {
        cVar3 = *name;
        name = name + 1;
      } while (cVar3 != ':');
      len = keylen(name);
      sip24_update(&local_68,name,len);
      do {
        pXVar20 = (parser->m_tempPool).ptr;
        if (pXVar20 == (parser->m_tempPool).end) {
          XVar11 = poolGrow(pool);
          if (XVar11 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar20 = (parser->m_tempPool).ptr;
        }
        XVar2 = *name;
        (parser->m_tempPool).ptr = pXVar20 + 1;
        *pXVar20 = XVar2;
        cVar3 = *name;
        name = name + 1;
      } while (cVar3 != '\0');
      uVar24 = sip24_final(&local_68);
      uVar12 = uVar17 & (uint)uVar24;
      pNVar22 = parser->m_nsAtts;
      bVar32 = 0;
      while (pNVar22[(int)uVar12].version == uVar30) {
        if (uVar24 == pNVar22[(int)uVar12].hash) {
          for (lVar29 = 0;
              (cVar3 = (parser->m_tempPool).start[lVar29], cVar3 != '\0' &&
              (cVar3 == pNVar22[(int)uVar12].uriName[lVar29])); lVar29 = lVar29 + 1) {
          }
          if (cVar3 == '\0') {
            return XML_ERROR_DUPLICATE_ATTRIBUTE;
          }
        }
        if (bVar32 == 0) {
          bVar32 = (byte)((uVar24 & ~(long)(int)uVar17) >>
                         ((char)*(undefined4 *)&parser->m_nsAttsPower - 1U & 0x3f)) &
                   (byte)((ulong)(long)(int)uVar17 >> 2) | 1;
        }
        iVar14 = 0;
        if ((int)uVar12 < (int)(uint)bVar32) {
          iVar14 = iVar13;
        }
        uVar12 = (uVar12 - bVar32) + iVar14;
      }
      if (parser->m_ns_triplets != '\0') {
        (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
        pcVar34 = *(char **)*puVar8;
        do {
          pcVar25 = (parser->m_tempPool).ptr;
          if (pcVar25 == (parser->m_tempPool).end) {
            XVar11 = poolGrow(pool);
            if (XVar11 == '\0') {
              return XML_ERROR_NO_MEMORY;
            }
            pcVar25 = (parser->m_tempPool).ptr;
          }
          cVar3 = *pcVar34;
          (parser->m_tempPool).ptr = pcVar25 + 1;
          *pcVar25 = cVar3;
          cVar3 = *pcVar34;
          pcVar34 = pcVar34 + 1;
        } while (cVar3 != '\0');
      }
      pcVar34 = (parser->m_tempPool).start;
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      (&pAVar18->name)[lVar21] = pcVar34;
      pNVar22 = parser->m_nsAtts;
      pNVar22[(int)uVar12].version = uVar30;
      pNVar22[(int)uVar12].hash = uVar24;
      pNVar22[(int)uVar12].uriName = pcVar34;
      iVar16 = iVar16 + -1;
      if (iVar16 == 0) {
        lVar21 = lVar21 + 2;
        break;
      }
    }
    else {
      name[-1] = '\0';
    }
  }
LAB_0032dbd9:
  for (lVar21 = (long)(int)lVar21; lVar21 < lVar35; lVar21 = lVar21 + 2) {
    (&pAVar18->name)[lVar21][-1] = '\0';
  }
  while (pBVar33 = *bindingsPtr, pBVar33 != (BINDING *)0x0) {
    pBVar33->attId->name[-1] = '\0';
    bindingsPtr = &pBVar33->nextTagBinding;
  }
  if (parser->m_ns != '\0') {
    if (elementType->prefix == (PREFIX *)0x0) {
      pBVar33 = (pDVar4->defaultPrefix).binding;
      if (pBVar33 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar34 = tagNamePtr->str;
    }
    else {
      pBVar33 = elementType->prefix->binding;
      if (pBVar33 == (BINDING *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      pcVar34 = tagNamePtr->str;
      do {
        cVar3 = *pcVar34;
        pcVar34 = pcVar34 + 1;
      } while (cVar3 != ':');
    }
    lVar21 = 0;
    pXVar20 = pBVar33->prefix->name;
    if ((parser->m_ns_triplets != '\0') && (pXVar20 != (XML_Char *)0x0)) {
      lVar21 = 0;
      do {
        pcVar25 = pXVar20 + lVar21;
        lVar21 = lVar21 + 1;
      } while (*pcVar25 != '\0');
    }
    tagNamePtr->localPart = pcVar34;
    iVar16 = pBVar33->uriLen;
    tagNamePtr->uriLen = iVar16;
    tagNamePtr->prefix = pXVar20;
    iVar13 = (int)lVar21;
    tagNamePtr->prefixLen = iVar13;
    uVar27 = 0;
    do {
      uVar31 = uVar27;
      uVar27 = uVar31 + 1;
    } while (pcVar34[uVar31] != '\0');
    if (pBVar33->uriAlloc < iVar16 + iVar13 + (int)uVar27) {
      iVar16 = iVar16 + iVar13 + (int)uVar27 + 0x18;
      pXVar20 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)iVar16);
      if (pXVar20 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pBVar33->uriAlloc = iVar16;
      memcpy(pXVar20,pBVar33->uri,(long)pBVar33->uriLen);
      pTVar26 = (TAG *)&parser->m_tagStack;
      pXVar7 = pBVar33->uri;
      while (pTVar26 = pTVar26->parent, pTVar26 != (TAG *)0x0) {
        if ((pTVar26->name).str == pXVar7) {
          (pTVar26->name).str = pXVar20;
        }
      }
      (*(parser->m_mem).free_fcn)(pXVar7);
      pBVar33->uri = pXVar20;
      iVar16 = pBVar33->uriLen;
    }
    else {
      pXVar20 = pBVar33->uri;
    }
    pXVar20 = pXVar20 + iVar16;
    memcpy(pXVar20,pcVar34,uVar27 & 0xffffffff);
    if (iVar13 != 0) {
      pXVar20[uVar31] = parser->m_namespaceSeparator;
      memcpy(pXVar20 + uVar27,pBVar33->prefix->name,(long)iVar13);
    }
    tagNamePtr->str = pBVar33->uri;
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc,
          const char *attStr, TAG_NAME *tagNamePtr,
          BINDING **bindingsPtr)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts;   /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str,0);
  if (!elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (!name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (!elementType)
      return XML_ERROR_NO_MEMORY;
    if (ns && !setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, attsSize, atts);
  if (n + nDefaultAtts > attsSize) {
    int oldAttsSize = attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif
    attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    temp = (ATTRIBUTE *)REALLOC((void *)atts, attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    atts = temp;
#ifdef XML_ATTR_INFO
    temp2 = (XML_AttrInfo *)REALLOC((void *)attInfo, attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, atts);
  }

  appAtts = (const XML_Char **)atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, currAtt->name,
                                         currAtt->name
                                         + XmlNameLength(enc, currAtt->name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart = parseEndByteIndex - (parseEndPtr - currAtt->name);
    currAttInfo->nameEnd = currAttInfo->nameStart +
                           XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parseEndByteIndex -
                            (parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parseEndByteIndex - (parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == encoding)
        eventPtr = atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   atts[i].valuePtr, atts[i].valueEnd,
                                   &tempPool);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&tempPool);
      poolFinish(&tempPool);
    }
    else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&tempPool, enc, atts[i].valuePtr,
                                          atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        idAttIndex = i;
        break;
      }
  }
  else
    idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (!(da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        }
        else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
      else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j;  /* hash table index */
    unsigned long version = nsAttsVersion;
    int nsAttsSize = (int)1 << nsAttsPower;
    unsigned char oldNsAttsPower = nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1) >> nsAttsPower) {  /* true for nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> nsAttsPower++);
      if (nsAttsPower < 3)
        nsAttsPower = 3;
      nsAttsSize = (int)1 << nsAttsPower;
      temp = (NS_ATT *)REALLOC(nsAtts, nsAttsSize * sizeof(NS_ATT));
      if (!temp) {
        /* Restore actual size of memory in nsAtts */
        nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      nsAtts = temp;
      version = 0;  /* force re-initialization of nsAtts hash table */
    }
    /* using a version flag saves us from initializing nsAtts every time */
    if (!version) {  /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0; )
        nsAtts[--j].version = version;
    }
    nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) {  /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0;  /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (!id || !id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (!b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (!poolAppendChar(&tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do {  /* copies null terminator */
          if (!poolAppendChar(&tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask;  /* index into hash table */
          while (nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&tempPool);
              const XML_Char *s2 = nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++);
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (!step)
              step = PROBE_STEP(uriHash, mask, nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (ns_triplets) {  /* append namespace separator and prefix */
          tempPool.ptr[-1] = namespaceSeparator;
          s = b->prefix->name;
          do {
            if (!poolAppendChar(&tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&tempPool);
        poolFinish(&tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        nsAtts[j].version = version;
        nsAtts[j].hash = uriHash;
        nsAtts[j].uriName = s;

        if (!--nPrefixes) {
          i += 2;
          break;
        }
      }
      else  /* not prefixed */
        ((XML_Char *)s)[-1] = 0;  /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (!ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  }
  else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ;  /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ;  /* i includes null terminator */
  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    uri = (XML_Char *)MALLOC((n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(binding->uri);
    binding->uri = uri;
  }
  /* if namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = namespaceSeparator;  /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}